

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool bssl::anon_unknown_0::MakeECHConfig
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,ECHConfigParams *params)

{
  uint16_t *puVar1;
  uint16_t value;
  int iVar2;
  EVP_HPKE_KEM *kem;
  uint8_t *puVar3;
  uint8_t *puVar4;
  size_t sVar5;
  bool bVar6;
  uint16_t *puVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> public_key;
  ScopedCBB cbb;
  CBB child;
  CBB contents;
  
  value = params->kem_id;
  if (value == 0) {
    kem = EVP_HPKE_KEY_kem(params->key);
    value = EVP_HPKE_KEM_id(kem);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&public_key,&params->public_key);
  if (public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&public_key,0x41);
    iVar2 = EVP_HPKE_KEY_public_key
                      (params->key,
                       public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,(size_t *)&cbb,
                       (long)public_key.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)public_key.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (iVar2 == 0) {
      bVar6 = false;
      goto LAB_0015ba3f;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&public_key,(size_type)cbb.ctx_.child);
  }
  CBB_zero(&cbb.ctx_);
  iVar2 = CBB_init(&cbb.ctx_,0x40);
  if ((((iVar2 == 0) || (iVar2 = CBB_add_u16(&cbb.ctx_,params->version), iVar2 == 0)) ||
      (iVar2 = CBB_add_u16_length_prefixed(&cbb.ctx_,&contents), iVar2 == 0)) ||
     (((iVar2 = CBB_add_u8(&contents,(uint8_t)params->config_id), iVar2 == 0 ||
       (iVar2 = CBB_add_u16(&contents,value), iVar2 == 0)) ||
      ((iVar2 = CBB_add_u16_length_prefixed(&contents,&child), iVar2 == 0 ||
       ((iVar2 = CBB_add_bytes(&child,public_key.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                               (long)public_key.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)public_key.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start), iVar2 == 0 ||
        (iVar2 = CBB_add_u16_length_prefixed(&contents,&child), iVar2 == 0)))))))) {
LAB_0015ba33:
    bVar6 = false;
  }
  else {
    puVar7 = (params->cipher_suites).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (params->cipher_suites).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar6 = false;
    do {
      if (puVar7 == puVar1) {
        iVar2 = CBB_add_u8(&contents,(uint8_t)params->max_name_len);
        if (((((iVar2 == 0) || (iVar2 = CBB_add_u8_length_prefixed(&contents,&child), iVar2 == 0))
             || (iVar2 = CBB_add_bytes(&child,(uint8_t *)(params->public_name)._M_dataplus._M_p,
                                       (params->public_name)._M_string_length), iVar2 == 0)) ||
            ((iVar2 = CBB_add_u16_length_prefixed(&contents,&child), iVar2 == 0 ||
             (puVar3 = (params->extensions).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,
             iVar2 = CBB_add_bytes(&child,puVar3,
                                   (long)(params->extensions).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3),
             iVar2 == 0)))) || (iVar2 = CBB_flush(&cbb.ctx_), iVar2 == 0)) goto LAB_0015ba33;
        puVar3 = CBB_data(&cbb.ctx_);
        puVar4 = CBB_data(&cbb.ctx_);
        sVar5 = CBB_len(&cbb.ctx_);
        bVar6 = true;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,puVar3,puVar4 + sVar5)
        ;
        break;
      }
      iVar2 = CBB_add_u16(&child,*puVar7);
      puVar7 = puVar7 + 1;
    } while (iVar2 != 0);
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
LAB_0015ba3f:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar6;
}

Assistant:

bool MakeECHConfig(std::vector<uint8_t> *out, const ECHConfigParams &params) {
  uint16_t kem_id = params.kem_id == 0
                        ? EVP_HPKE_KEM_id(EVP_HPKE_KEY_kem(params.key))
                        : params.kem_id;
  std::vector<uint8_t> public_key = params.public_key;
  if (public_key.empty()) {
    public_key.resize(EVP_HPKE_MAX_PUBLIC_KEY_LENGTH);
    size_t len;
    if (!EVP_HPKE_KEY_public_key(params.key, public_key.data(), &len,
                                 public_key.size())) {
      return false;
    }
    public_key.resize(len);
  }

  bssl::ScopedCBB cbb;
  CBB contents, child;
  if (!CBB_init(cbb.get(), 64) ||                                      //
      !CBB_add_u16(cbb.get(), params.version) ||                       //
      !CBB_add_u16_length_prefixed(cbb.get(), &contents) ||            //
      !CBB_add_u8(&contents, params.config_id) ||                      //
      !CBB_add_u16(&contents, kem_id) ||                               //
      !CBB_add_u16_length_prefixed(&contents, &child) ||               //
      !CBB_add_bytes(&child, public_key.data(), public_key.size()) ||  //
      !CBB_add_u16_length_prefixed(&contents, &child)) {
    return false;
  }
  for (uint16_t cipher_suite : params.cipher_suites) {
    if (!CBB_add_u16(&child, cipher_suite)) {
      return false;
    }
  }
  if (!CBB_add_u8(&contents, params.max_name_len) ||
      !CBB_add_u8_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(
          &child, reinterpret_cast<const uint8_t *>(params.public_name.data()),
          params.public_name.size()) ||
      !CBB_add_u16_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(&child, params.extensions.data(),
                     params.extensions.size()) ||
      !CBB_flush(cbb.get())) {
    return false;
  }

  out->assign(CBB_data(cbb.get()), CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}